

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset.c
# Opt level: O3

int raviX_bitset_equal_p(BitSet *bm1,BitSet *bm2)

{
  ulong uVar1;
  bitset_el_t *__s2;
  int iVar2;
  int iVar3;
  BitSet *pBVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar6 = bm1->els_num;
  uVar1 = bm2->els_num;
  pBVar4 = bm2;
  uVar5 = uVar1;
  if (uVar1 < uVar6) {
    pBVar4 = bm1;
    bm1 = bm2;
    uVar5 = uVar6;
    uVar6 = uVar1;
  }
  __s2 = pBVar4->varr;
  iVar2 = bcmp(bm1->varr,__s2,uVar6 * 8);
  iVar3 = 0;
  if (iVar2 == 0) {
    if (uVar6 < uVar5) {
      do {
        if (__s2[uVar6] != 0) {
          return 0;
        }
        uVar6 = uVar6 + 1;
      } while (uVar5 != uVar6);
    }
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

int raviX_bitset_equal_p(const BitSet * bm1, const BitSet * bm2) {
	const BitSet * temp_bm;
	size_t i, temp_len, bm1_len = bm1->els_num;
	size_t bm2_len = bm2->els_num;
	bitset_el_t *addr1, *addr2;

	if (bm1_len > bm2_len) {
		temp_bm = bm1;
		bm1 = bm2;
		bm2 = temp_bm;
		temp_len = bm1_len;
		bm1_len = bm2_len;
		bm2_len = temp_len;
	}
	addr1 = bm1->varr;
	addr2 = bm2->varr;
	if (memcmp (addr1, addr2, bm1_len * sizeof (bitset_el_t)) != 0) return false;
	for (i = bm1_len; i < bm2_len; i++)
		if (addr2[i] != 0) return false;
	return true;
}